

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O0

void __thiscall imrt::Ant::printReferencePlan(Ant *this)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  mapped_type *this_00;
  reference pvVar4;
  long in_RDI;
  int i;
  int a;
  int s;
  int local_14;
  int local_10;
  int local_c;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Reference plan:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x44); local_c = local_c + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Station");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,local_c);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x40); local_10 = local_10 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Aperture ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,local_10);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      local_14 = 0;
      while( true ) {
        iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0x38));
        if (iVar1 <= local_14) break;
        std::
        vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
        ::operator[]((vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                      *)(in_RDI + 8),(long)local_c);
        this_00 = std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                *)this,_a);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_14);
        pvVar3 = (void *)std::ostream::operator<<(&std::cout,*pvVar4);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        local_14 = local_14 + 1;
      }
    }
  }
  return;
}

Assistant:

void Ant::printReferencePlan() {
    cout << "--------------------------------------------"<< endl;
    cout << "Reference plan:" << endl;
    cout << "--------------------------------------------"<< endl;
    for (int s=0; s<n_stations; s++) {
      cout << "Station" << s << endl;
      for (int a=0; a<n_apertures; a++) {
        cout << "Aperture " << a << endl;
        for (int i=0; i<collimator.getXdim(); i++) {
          cout << ref_plan[s][a][i] << endl;
          
        }
      }
    }
  }